

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int xmlCtxtUseOptions(xmlParserCtxtPtr ctxt,int options)

{
  int keepMask;
  int options_local;
  xmlParserCtxtPtr ctxt_local;
  
  if ((ctxt == (xmlParserCtxtPtr)0x0) || (ctxt->html == 0)) {
    ctxt_local._4_4_ = xmlCtxtSetOptionsInternal(ctxt,options,0x7b6860);
  }
  else {
    ctxt_local._4_4_ = htmlCtxtUseOptions(ctxt,options);
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlCtxtUseOptions(xmlParserCtxtPtr ctxt, int options)
{
    int keepMask;

#ifdef LIBXML_HTML_ENABLED
    if ((ctxt != NULL) && (ctxt->html))
        return(htmlCtxtUseOptions(ctxt, options));
#endif

    /*
     * For historic reasons, some options can only be enabled.
     */
    keepMask = XML_PARSE_NOERROR |
               XML_PARSE_NOWARNING |
               XML_PARSE_NONET |
               XML_PARSE_NSCLEAN |
               XML_PARSE_NOCDATA |
               XML_PARSE_COMPACT |
               XML_PARSE_OLD10 |
               XML_PARSE_HUGE |
               XML_PARSE_OLDSAX |
               XML_PARSE_IGNORE_ENC |
               XML_PARSE_BIG_LINES;

    return(xmlCtxtSetOptionsInternal(ctxt, options, keepMask));
}